

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O3

void __thiscall
google::protobuf::compiler::js::Generator::GenerateFieldValueExpression
          (Generator *this,Printer *printer,char *obj_reference,FieldDescriptor *field,
          bool use_default)

{
  byte bVar1;
  int iVar2;
  char *pcVar3;
  Type TVar4;
  EnumValueDescriptor *pEVar5;
  LogMessage *pLVar6;
  long *plVar7;
  undefined8 *puVar8;
  ushort uVar9;
  size_type *psVar10;
  ulong *puVar11;
  ushort uVar12;
  int i;
  FieldDescriptor *extraout_RDX;
  FieldDescriptor *field_00;
  FieldDescriptor *field_01;
  FieldDescriptor *pFVar13;
  long i_00;
  FieldDescriptor *field_02;
  long lVar14;
  ulong uVar15;
  ushort uVar16;
  undefined8 uVar17;
  char *pcVar18;
  char cVar19;
  _Alloc_hider _Var20;
  long lVar21;
  ulong uVar22;
  string result;
  string out;
  allocator local_9a;
  LogFinisher local_99;
  string local_98;
  string local_78;
  Printer *local_58;
  string local_50;
  
  TVar4 = FieldDescriptor::type(field);
  if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) != 6) {
    TVar4 = FieldDescriptor::type(field);
    if (use_default) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) == 5) goto LAB_00221e56;
      goto LAB_00221e65;
    }
    pFVar13 = field_00;
    if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4) == 5) goto LAB_00221eb9;
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_(&result,(_anonymous_namespace_ *)field,field_00);
    std::__cxx11::string::string((string *)&out,obj_reference,(allocator *)&local_78);
    io::Printer::Print(printer,"jspb.Message.getField($obj$, $index$)","index",&result,"obj",&out);
LAB_0022208f:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != &out.field_2) {
      operator_delete(out._M_dataplus._M_p,
                      CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0])
                      + 1);
    }
    local_78.field_2._M_allocated_capacity = result.field_2._M_allocated_capacity;
    local_78._M_dataplus._M_p = result._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p == &result.field_2) {
      return;
    }
    goto LAB_002222e0;
  }
  pFVar13 = extraout_RDX;
  if (!use_default) {
LAB_00221eb9:
    iVar2 = *(int *)(field + 0x4c);
    if (iVar2 == 2) {
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_(&result,(_anonymous_namespace_ *)field,pFVar13)
      ;
      std::__cxx11::string::string((string *)&out,obj_reference,(allocator *)&local_78);
      io::Printer::Print(printer,"+jspb.Message.getField($obj$, $index$)","index",&result,"obj",&out
                        );
      goto LAB_0022208f;
    }
    pcVar18 = "GPBFieldOptional";
    if (iVar2 == 3) {
      pcVar18 = "GPBFieldRepeated";
    }
    pcVar3 = "GPBFieldOptional";
    if (iVar2 == 3) {
      pcVar3 = "GPBFieldRepeated";
    }
    result._M_dataplus._M_p = (pointer)&result.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&result,pcVar18 + 8,pcVar3 + 0x10);
    (anonymous_namespace)::JSFieldIndex_abi_cxx11_(&out,(_anonymous_namespace_ *)field,field_02);
    std::__cxx11::string::string((string *)&local_78,obj_reference,(allocator *)&local_50);
    io::Printer::Print(printer,"jspb.Message.get$cardinality$FloatingPointField($obj$, $index$)",
                       "cardinality",&result,"index",&out,"obj",&local_78);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_78._M_dataplus._M_p != &local_78.field_2) {
      operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != &out.field_2) {
      operator_delete(out._M_dataplus._M_p,
                      CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0])
                      + 1);
    }
    local_78.field_2._M_allocated_capacity = result.field_2._M_allocated_capacity;
    local_78._M_dataplus._M_p = result._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p == &result.field_2) {
      return;
    }
    goto LAB_002222e0;
  }
LAB_00221e56:
  io::Printer::Print(printer,"+");
LAB_00221e65:
  std::__cxx11::string::string((string *)&local_78,obj_reference,&local_9a);
  pFVar13 = field;
  (anonymous_namespace)::JSFieldIndex_abi_cxx11_(&local_50,(_anonymous_namespace_ *)field,field_01);
  if (*(int *)(field + 0x4c) == 3) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 2;
    local_98.field_2._M_allocated_capacity._0_3_ = 0x5d5b;
    goto LAB_0022224b;
  }
  TVar4 = FieldDescriptor::type(field);
  switch(*(undefined4 *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)TVar4 * 4)) {
  case 1:
    SimpleItoa_abi_cxx11_(&result,(protobuf *)(ulong)*(uint *)(field + 0xa0),(int)i_00);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,result._M_dataplus._M_p,
               result._M_dataplus._M_p + result._M_string_length);
    break;
  case 2:
    SimpleItoa_abi_cxx11_(&result,*(protobuf **)(field + 0xa0),i_00);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,result._M_dataplus._M_p,
               result._M_dataplus._M_p + result._M_string_length);
    break;
  case 3:
    SimpleItoa_abi_cxx11_(&result,(protobuf *)(ulong)*(uint *)(field + 0xa0),(int)i_00);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,result._M_dataplus._M_p,
               result._M_dataplus._M_p + result._M_string_length);
    break;
  case 4:
    SimpleItoa_abi_cxx11_(&result,*(protobuf **)(field + 0xa0),i_00);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_98,result._M_dataplus._M_p,
               result._M_dataplus._M_p + result._M_string_length);
    break;
  case 5:
    SimpleDtoa_abi_cxx11_(&result,(protobuf *)pFVar13,*(double *)(field + 0xa0));
    out._M_dataplus._M_p = (pointer)&out.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&out,result._M_dataplus._M_p,
               result._M_dataplus._M_p + result._M_string_length);
    anon_unknown_0::PostProcessFloat(&local_98,&out);
    goto LAB_00222219;
  case 6:
    SimpleFtoa_abi_cxx11_(&result,(protobuf *)pFVar13,*(float *)(field + 0xa0));
    out._M_dataplus._M_p = (pointer)&out.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&out,result._M_dataplus._M_p,
               result._M_dataplus._M_p + result._M_string_length);
    anon_unknown_0::PostProcessFloat(&local_98,&out);
LAB_00222219:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p != &out.field_2) {
      operator_delete(out._M_dataplus._M_p,
                      CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0])
                      + 1);
    }
    break;
  case 7:
    pcVar18 = "false";
    if ((ulong)(byte)field[0xa0] != 0) {
      pcVar18 = "true";
    }
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,pcVar18,pcVar18 + ((ulong)(byte)field[0xa0] ^ 5));
    goto LAB_0022224b;
  case 8:
    pEVar5 = FieldDescriptor::default_value_enum(field);
    SimpleItoa_abi_cxx11_(&local_98,(protobuf *)(ulong)*(uint *)(pEVar5 + 0x10),i);
    goto LAB_0022224b;
  case 9:
    TVar4 = FieldDescriptor::type(field);
    if (TVar4 != TYPE_STRING) {
      lVar21 = *(long *)(field + 0xa0);
      out._M_dataplus._M_p = (pointer)&out.field_2;
      out._M_string_length = 0;
      out.field_2._M_local_buf[0] = '\0';
      local_58 = printer;
      if (*(long *)(lVar21 + 8) != 0) {
        lVar14 = 2;
        do {
          cVar19 = (char)&out;
          std::__cxx11::string::push_back(cVar19);
          std::__cxx11::string::push_back(cVar19);
          std::__cxx11::string::push_back(cVar19);
          std::__cxx11::string::push_back(cVar19);
          uVar15 = lVar14 + 1;
          lVar14 = lVar14 + 3;
        } while (uVar15 < *(ulong *)(lVar21 + 8));
      }
      plVar7 = (long *)std::__cxx11::string::replace((ulong)&out,0,(char *)0x0,0x351813);
      psVar10 = (size_type *)(plVar7 + 2);
      if ((size_type *)*plVar7 == psVar10) {
        result.field_2._M_allocated_capacity = *psVar10;
        result.field_2._8_8_ = plVar7[3];
        result._M_dataplus._M_p = (pointer)&result.field_2;
      }
      else {
        result.field_2._M_allocated_capacity = *psVar10;
        result._M_dataplus._M_p = (pointer)*plVar7;
      }
      result._M_string_length = plVar7[1];
      *plVar7 = (long)psVar10;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      plVar7 = (long *)std::__cxx11::string::append((char *)&result);
      printer = local_58;
      local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
      puVar11 = (ulong *)(plVar7 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar7 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)puVar11) {
        local_98.field_2._M_allocated_capacity = *puVar11;
        local_98.field_2._8_8_ = plVar7[3];
      }
      else {
        local_98.field_2._M_allocated_capacity = *puVar11;
        local_98._M_dataplus._M_p = (pointer)*plVar7;
      }
      local_98._M_string_length = plVar7[1];
      *plVar7 = (long)puVar11;
      plVar7[1] = 0;
      *(undefined1 *)(plVar7 + 2) = 0;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)result._M_dataplus._M_p != &result.field_2) {
        operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)out._M_dataplus._M_p != &out.field_2) goto LAB_0022289d;
      goto LAB_0022224b;
    }
    out._M_dataplus._M_p = (pointer)&out.field_2;
    out._M_string_length = 0;
    out.field_2._M_local_buf[0] = '\0';
    plVar7 = *(long **)(field + 0xa0);
    uVar15 = plVar7[1];
    if (uVar15 != 0) {
      uVar22 = 0;
      do {
        lVar21 = *plVar7;
        if (uVar22 + 1 < uVar15) {
          uVar9 = *(byte *)(lVar21 + uVar22 + 1) & 0x3f;
        }
        else {
          uVar9 = 0;
        }
        if (uVar22 + 2 < uVar15) {
          uVar16 = *(byte *)(lVar21 + uVar22 + 2) & 0x3f;
        }
        else {
          uVar16 = 0;
        }
        bVar1 = *(byte *)(lVar21 + uVar22);
        uVar12 = (ushort)bVar1;
        if ((char)bVar1 < '\0') {
          if ((bVar1 & 0xe0) == 0xc0) {
            if (uVar15 - uVar22 == 1) {
LAB_002227af:
              internal::LogMessage::LogMessage
                        ((LogMessage *)&result,LOGLEVEL_WARNING,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
                         ,799);
              pLVar6 = internal::LogMessage::operator<<
                                 ((LogMessage *)&result,"The default value for field ");
              pLVar6 = internal::LogMessage::operator<<(pLVar6,*(string **)(field + 8));
              pLVar6 = internal::LogMessage::operator<<
                                 (pLVar6,
                                  " was truncated since it contained invalid UTF-8 or codepoints outside the basic multilingual plane."
                                 );
              internal::LogFinisher::operator=(&local_99,pLVar6);
              internal::LogMessage::~LogMessage((LogMessage *)&result);
              break;
            }
            uVar12 = uVar9 | (bVar1 & 0x1f) << 6;
            lVar21 = 2;
          }
          else {
            if ((uVar15 - uVar22 < 3) || ((bVar1 & 0xf0) != 0xe0)) goto LAB_002227af;
            uVar12 = uVar16 | uVar9 << 6 | (ushort)bVar1 << 0xc;
            lVar21 = 3;
          }
        }
        else {
          lVar21 = 1;
        }
        if (0x25 < uVar12) {
          if (uVar12 < 0x3d) {
            if (((uVar12 != 0x26) && (uVar12 != 0x27)) && (uVar12 != 0x3c))
            goto switchD_0022248b_caseD_b;
          }
          else if (((uVar12 != 0x3d) && (uVar12 != 0x3e)) && (uVar12 != 0x5c))
          goto switchD_0022248b_caseD_b;
          goto LAB_0022253a;
        }
        switch(uVar12) {
        case 8:
          break;
        case 9:
          break;
        case 10:
          break;
        case 0xb:
switchD_0022248b_caseD_b:
          if ((ushort)(uVar12 - 0x20) < 0x5f) {
            std::__cxx11::string::push_back((char)&out);
          }
          else {
            if (uVar12 < 0x100) {
              StringPrintf_abi_cxx11_(&result,"\\x%02x");
              std::__cxx11::string::_M_append((char *)&out,(ulong)result._M_dataplus._M_p);
            }
            else {
              StringPrintf_abi_cxx11_(&result,"\\u%04x");
              std::__cxx11::string::_M_append((char *)&out,(ulong)result._M_dataplus._M_p);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)result._M_dataplus._M_p != &result.field_2) {
              operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
            }
          }
          goto LAB_00222542;
        case 0xc:
          break;
        case 0xd:
          break;
        default:
          if (uVar12 != 0x22) goto switchD_0022248b_caseD_b;
        }
LAB_0022253a:
        std::__cxx11::string::append((char *)&out);
LAB_00222542:
        uVar22 = uVar22 + lVar21;
        uVar15 = plVar7[1];
      } while (uVar22 < uVar15);
    }
    std::operator+(&result,"\"",&out);
    puVar8 = (undefined8 *)std::__cxx11::string::append((char *)&result);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    puVar11 = puVar8 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar8 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)puVar11) {
      local_98.field_2._M_allocated_capacity = *puVar11;
      local_98.field_2._8_8_ = puVar8[3];
    }
    else {
      local_98.field_2._M_allocated_capacity = *puVar11;
      local_98._M_dataplus._M_p = (pointer)*puVar8;
    }
    local_98._M_string_length = puVar8[1];
    *puVar8 = puVar11;
    puVar8[1] = 0;
    *(undefined1 *)(puVar8 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)result._M_dataplus._M_p != &result.field_2) {
      operator_delete(result._M_dataplus._M_p,result.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)out._M_dataplus._M_p == &out.field_2) goto LAB_0022224b;
LAB_0022289d:
    uVar17 = CONCAT71(out.field_2._M_allocated_capacity._1_7_,out.field_2._M_local_buf[0]);
    _Var20._M_p = out._M_dataplus._M_p;
    goto LAB_00222243;
  case 10:
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 4;
    local_98.field_2._M_allocated_capacity._0_5_ = 0x6c6c756e;
    goto LAB_0022224b;
  default:
    internal::LogMessage::LogMessage
              ((LogMessage *)&result,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/compiler/js/js_generator.cc"
               ,0x32a);
    pLVar6 = internal::LogMessage::operator<<((LogMessage *)&result,"Shouldn\'t reach here.");
    internal::LogFinisher::operator=((LogFinisher *)&out,pLVar6);
    internal::LogMessage::~LogMessage((LogMessage *)&result);
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    local_98._M_string_length = 0;
    local_98.field_2._M_allocated_capacity =
         local_98.field_2._M_allocated_capacity & 0xffffffffffffff00;
    goto LAB_0022224b;
  }
  uVar17 = result.field_2._M_allocated_capacity;
  _Var20._M_p = result._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)result._M_dataplus._M_p != &result.field_2) {
LAB_00222243:
    operator_delete(_Var20._M_p,uVar17 + 1);
  }
LAB_0022224b:
  io::Printer::Print(printer,"jspb.Message.getFieldWithDefault($obj$, $index$, $default$)","obj",
                     &local_78,"index",&local_50,"default",&local_98);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p != &local_98.field_2) {
    operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
LAB_002222e0:
    operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void Generator::GenerateFieldValueExpression(io::Printer* printer,
                                             const char *obj_reference,
                                             const FieldDescriptor* field,
                                             bool use_default) const {
  bool is_float_or_double =
      field->cpp_type() == FieldDescriptor::CPPTYPE_FLOAT ||
      field->cpp_type() == FieldDescriptor::CPPTYPE_DOUBLE;
  if (use_default) {
    if (is_float_or_double) {
      // Coerce "Nan" and "Infinity" to actual float values.
      //
      // This will change null to 0, but that doesn't matter since we're getting
      // with a default.
      printer->Print("+");
    }

    printer->Print(
        "jspb.Message.getFieldWithDefault($obj$, $index$, $default$)",
        "obj", obj_reference,
        "index", JSFieldIndex(field),
        "default", JSFieldDefault(field));
  } else {
    if (is_float_or_double) {
      if (field->is_required()) {
        // Use "+" to convert all fields to numeric (including null).
        printer->Print(
            "+jspb.Message.getField($obj$, $index$)",
            "index", JSFieldIndex(field),
            "obj", obj_reference);
      } else {
        // Converts "NaN" and "Infinity" while preserving null.
        printer->Print(
            "jspb.Message.get$cardinality$FloatingPointField($obj$, $index$)",
            "cardinality", field->is_repeated() ? "Repeated" : "Optional",
            "index", JSFieldIndex(field),
            "obj", obj_reference);
      }
    } else {
      printer->Print("jspb.Message.getField($obj$, $index$)",
                     "index", JSFieldIndex(field),
                     "obj", obj_reference);
    }
  }
}